

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Function::ForEachDebugInstructionsInHeader
          (Function *this,function<void_(spvtools::opt::Instruction_*)> *f)

{
  bool bVar1;
  Instruction *pIVar2;
  Instruction *next_instruction;
  Instruction *di;
  function<void_(spvtools::opt::Instruction_*)> *f_local;
  Function *this_local;
  
  bVar1 = utils::IntrusiveList<spvtools::opt::Instruction>::empty
                    (&(this->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>
                    );
  if (!bVar1) {
    next_instruction =
         utils::IntrusiveList<spvtools::opt::Instruction>::front
                   (&(this->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>)
    ;
    while (next_instruction != (Instruction *)0x0) {
      pIVar2 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                         (&next_instruction->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
      Instruction::ForEachInst(next_instruction,f,false);
      next_instruction = pIVar2;
    }
  }
  return;
}

Assistant:

void Function::ForEachDebugInstructionsInHeader(
    const std::function<void(Instruction*)>& f) {
  if (debug_insts_in_header_.empty()) return;

  Instruction* di = &debug_insts_in_header_.front();
  while (di != nullptr) {
    Instruction* next_instruction = di->NextNode();
    di->ForEachInst(f);
    di = next_instruction;
  }
}